

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AuthCheck(Parse *pParse,int code,char *zArg1,char *zArg2,char *zArg3)

{
  sqlite3 *psVar1;
  int local_44;
  int rc;
  sqlite3 *db;
  char *zArg3_local;
  char *zArg2_local;
  char *zArg1_local;
  int code_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  if (((psVar1->init).busy == '\0') && (pParse->declareVtab == '\0')) {
    if (psVar1->xAuth == (sqlite3_xauth)0x0) {
      pParse_local._4_4_ = 0;
    }
    else {
      local_44 = (*psVar1->xAuth)(psVar1->pAuthArg,code,zArg1,zArg2,zArg3,pParse->zAuthContext);
      if (local_44 == 1) {
        sqlite3ErrorMsg(pParse,"not authorized");
        pParse->rc = 0x17;
      }
      else if ((local_44 != 0) && (local_44 != 2)) {
        local_44 = 1;
        sqliteAuthBadReturnCode(pParse);
      }
      pParse_local._4_4_ = local_44;
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3AuthCheck(
  Parse *pParse,
  int code,
  const char *zArg1,
  const char *zArg2,
  const char *zArg3
){
  sqlite3 *db = pParse->db;
  int rc;

  /* Don't do any authorization checks if the database is initialising
  ** or if the parser is being invoked from within sqlite3_declare_vtab.
  */
  if( db->init.busy || IN_DECLARE_VTAB ){
    return SQLITE_OK;
  }

  if( db->xAuth==0 ){
    return SQLITE_OK;
  }
  rc = db->xAuth(db->pAuthArg, code, zArg1, zArg2, zArg3, pParse->zAuthContext
#ifdef SQLITE_USER_AUTHENTICATION
                 ,db->auth.zAuthUser
#endif
                );
  if( rc==SQLITE_DENY ){
    sqlite3ErrorMsg(pParse, "not authorized");
    pParse->rc = SQLITE_AUTH;
  }else if( rc!=SQLITE_OK && rc!=SQLITE_IGNORE ){
    rc = SQLITE_DENY;
    sqliteAuthBadReturnCode(pParse);
  }
  return rc;
}